

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_template.hpp
# Opt level: O0

iterator_range<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
 boost::detail::function::
 function_obj_invoker2<boost::algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>_>,_boost::iterator_range<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
 ::invoke(function_buffer *function_obj_ptr,
         __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         a0,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            a1)

{
  void *this;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  Begin;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_Var1;
  iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
  iVar2;
  token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *f;
  function_buffer *function_obj_ptr_local;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  a1_local;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  a0_local;
  
  this = *(void **)function_obj_ptr;
  function_obj_ptr_local = (function_buffer *)a1._M_current;
  a1_local = a0;
  p_Var1 = forward<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(&a1_local);
  Begin._M_current = p_Var1->_M_current;
  p_Var1 = forward<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                     ((type *)&function_obj_ptr_local);
  iVar2.
  super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
       = (iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
          )algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>>::operator()
                     (this,Begin,
                      (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )p_Var1->_M_current);
  return (iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
          )(iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
            )iVar2.
             super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
             .
             super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
  ;
}

Assistant:

static R invoke(function_buffer& function_obj_ptr BOOST_FUNCTION_COMMA
                        BOOST_FUNCTION_PARMS)

        {
          FunctionObj* f;
          if (function_allows_small_object_optimization<FunctionObj>::value)
            f = reinterpret_cast<FunctionObj*>(function_obj_ptr.data);
          else
            f = reinterpret_cast<FunctionObj*>(function_obj_ptr.members.obj_ptr);
          return (*f)(BOOST_FUNCTION_ARGS);
        }